

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.cc
# Opt level: O1

void __thiscall
wabt::BindingHash::CreateDuplicatesVector(BindingHash *this,ValueTypeVector *out_duplicates)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  *ppVar1;
  pointer *ppppVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  *ppVar3;
  iterator iVar4;
  bool bVar5;
  int iVar6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  _Hash_node_base *p_Var9;
  bool bVar10;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  *local_38;
  
  p_Var8 = (this->
           super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
           )._M_h._M_before_begin._M_nxt;
  p_Var9 = p_Var8->_M_nxt;
  if (p_Var9 != (_Hash_node_base *)0x0) {
    bVar5 = true;
    do {
      ppVar3 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                *)(p_Var8 + 1);
      ppVar1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                *)(p_Var9 + 1);
      p_Var7 = p_Var8[2]._M_nxt;
      if (p_Var7 == p_Var9[2]._M_nxt) {
        if (p_Var7 == (_Hash_node_base *)0x0) {
          bVar10 = true;
        }
        else {
          iVar6 = bcmp((ppVar3->first)._M_dataplus._M_p,(ppVar1->first)._M_dataplus._M_p,
                       (size_t)p_Var7);
          bVar10 = iVar6 == 0;
        }
      }
      else {
        bVar10 = false;
      }
      p_Var7 = p_Var9;
      if (bVar10) {
        if (bVar5) {
          iVar4._M_current =
               (out_duplicates->
               super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (out_duplicates->
              super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_38 = ppVar3;
            std::
            vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
            ::_M_realloc_insert<std::pair<std::__cxx11::string_const,wabt::Binding>const*>
                      ((vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
                        *)out_duplicates,iVar4,&local_38);
          }
          else {
            *iVar4._M_current = ppVar3;
            ppppVar2 = &(out_duplicates->
                        super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *ppppVar2 = *ppppVar2 + 1;
          }
        }
        iVar4._M_current =
             (out_duplicates->
             super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        p_Var7 = p_Var8;
        local_38 = ppVar1;
        if (iVar4._M_current ==
            (out_duplicates->
            super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
          ::_M_realloc_insert<std::pair<std::__cxx11::string_const,wabt::Binding>const*>
                    ((vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
                      *)out_duplicates,iVar4,&local_38);
        }
        else {
          *iVar4._M_current = ppVar1;
          ppppVar2 = &(out_duplicates->
                      super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *ppppVar2 = *ppppVar2 + 1;
        }
      }
      bVar5 = (bool)(bVar10 ^ 1);
      p_Var9 = p_Var9->_M_nxt;
      p_Var8 = p_Var7;
    } while (p_Var9 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void BindingHash::CreateDuplicatesVector(
    ValueTypeVector* out_duplicates) const {
  // This relies on the fact that in an unordered_multimap, all values with the
  // same key are adjacent in iteration order.
  auto first = begin();
  bool is_first = true;
  for (auto iter = std::next(first); iter != end(); ++iter) {
    if (first->first == iter->first) {
      if (is_first) {
        out_duplicates->push_back(&*first);
      }
      out_duplicates->push_back(&*iter);
      is_first = false;
    } else {
      is_first = true;
      first = iter;
    }
  }
}